

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O1

void __thiscall
CombinedH264Demuxer::setFileIterator(CombinedH264Demuxer *this,FileNameIterator *itr)

{
  BufferedReader *this_00;
  undefined4 *puVar1;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  this_00 = (BufferedReader *)this->m_bufferedReader;
  if ((this_00 == (BufferedReader *)0x0) ||
     ((this_00->super_AbstractReader)._vptr_AbstractReader !=
      (_func_int **)&PTR__BufferedReader_0023fda0)) {
    this_00 = (BufferedReader *)0x0;
  }
  if (this_00 != (BufferedReader *)0x0) {
    BufferedReader::setFileIterator(this_00,itr,this->m_readerID);
    return;
  }
  if (itr == (FileNameIterator *)0x0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "Can not set file iterator. Reader does not support bufferedReader interface.",0x4c);
  puVar1 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar1 = 3;
  *(undefined4 **)(puVar1 + 2) = puVar1 + 6;
  if (local_1b0 == &local_1a0) {
    puVar1[6] = local_1a0;
    puVar1[7] = uStack_19c;
    puVar1[8] = uStack_198;
    puVar1[9] = uStack_194;
  }
  else {
    *(uint **)(puVar1 + 2) = local_1b0;
    *(ulong *)(puVar1 + 6) = CONCAT44(uStack_19c,local_1a0);
  }
  *(undefined8 *)(puVar1 + 4) = local_1a8;
  local_1a0 = local_1a0 & 0xffffff00;
  __cxa_throw(puVar1,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void CombinedH264Demuxer::setFileIterator(FileNameIterator* itr)
{
    const auto br = dynamic_cast<BufferedFileReader*>(m_bufferedReader);
    if (br)
        br->setFileIterator(itr, m_readerID);
    else if (itr != nullptr)
        THROW(ERR_COMMON, "Can not set file iterator. Reader does not support bufferedReader interface.")
}